

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddMouseButtonEvent(ImGuiIO *this,int mouse_button,bool down)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiInputEvent *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  long lVar7;
  ImGuiInputEvent *__dest;
  long lVar8;
  long lVar9;
  bool *pbVar10;
  int iVar11;
  ImGuiContext *g;
  bool bVar12;
  
  pIVar5 = GImGui;
  if (this->AppAcceptingEvents == true) {
    iVar2 = (GImGui->InputEventsQueue).Size;
    lVar7 = (long)iVar2;
    lVar9 = lVar7 * 3;
    lVar8 = lVar7 + 1;
    lVar7 = lVar7 * 0x18;
    do {
      if (lVar8 + -1 == 0 || lVar8 < 1) {
        lVar9 = 0;
        break;
      }
      pIVar4 = (GImGui->InputEventsQueue).Data;
      bVar12 = true;
      if (*(int *)((long)&pIVar4[-1].Type + lVar7) == 3) {
        bVar12 = *(int *)((long)&pIVar4[-1].field_2 + lVar7) != mouse_button;
        if (!bVar12) {
          lVar9 = (long)&pIVar4[-1].Type + lVar7;
        }
      }
      lVar8 = lVar8 + -1;
      lVar7 = lVar7 + -0x18;
    } while (bVar12);
    pbVar10 = (GImGui->IO).MouseDown + mouse_button;
    if (lVar9 != 0) {
      pbVar10 = (bool *)(lVar9 + 0xc);
    }
    if (*pbVar10 != down) {
      iVar3 = (GImGui->InputEventsQueue).Capacity;
      if (iVar2 == iVar3) {
        if (iVar3 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar3 / 2 + iVar3;
        }
        iVar11 = iVar2 + 1;
        if (iVar2 + 1 < iVar6) {
          iVar11 = iVar6;
        }
        if (iVar3 < iVar11) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (ImGuiInputEvent *)
                   (*GImAllocatorAllocFunc)((long)iVar11 * 0x18,GImAllocatorUserData);
          pIVar4 = (pIVar5->InputEventsQueue).Data;
          if (pIVar4 != (ImGuiInputEvent *)0x0) {
            memcpy(__dest,pIVar4,(long)(pIVar5->InputEventsQueue).Size * 0x18);
            pIVar4 = (pIVar5->InputEventsQueue).Data;
            if ((pIVar4 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
          }
          (pIVar5->InputEventsQueue).Data = __dest;
          (pIVar5->InputEventsQueue).Capacity = iVar11;
        }
      }
      pIVar4 = (pIVar5->InputEventsQueue).Data;
      iVar2 = (pIVar5->InputEventsQueue).Size;
      pIVar4[iVar2].Type = ImGuiInputEventType_MouseButton;
      pIVar4[iVar2].Source = ImGuiInputSource_Mouse;
      pIVar4[iVar2].field_2.MouseButton.Button = mouse_button;
      pIVar4[iVar2].field_2.MouseButton.Down = down;
      *(undefined8 *)((long)&pIVar4[iVar2].field_2 + 5) = 0;
      *(undefined4 *)&pIVar4[iVar2].AddedByTestEngine = 0;
      (pIVar5->InputEventsQueue).Size = (pIVar5->InputEventsQueue).Size + 1;
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddMouseButtonEvent(int mouse_button, bool down)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
    if (!AppAcceptingEvents)
        return;

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_MouseButton, (int)mouse_button);
    const bool latest_button_down = latest_event ? latest_event->MouseButton.Down : g.IO.MouseDown[mouse_button];
    if (latest_button_down == down)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseButton;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseButton.Button = mouse_button;
    e.MouseButton.Down = down;
    g.InputEventsQueue.push_back(e);
}